

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

int YPSpur_md_set_angvel(YPSpur *spur,double w)

{
  int iVar1;
  undefined1 local_58 [8];
  YPSpur_msg msg;
  double w_local;
  YPSpur *spur_local;
  
  local_58 = (undefined1  [8])0x1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x51;
  msg._16_8_ = w;
  msg.data[3] = w;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)local_58);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    spur_local._4_4_ = -1;
  }
  else {
    spur_local._4_4_ = 1;
  }
  return spur_local._4_4_;
}

Assistant:

int YPSpur_md_set_angvel(YPSpur* spur, double w)
{
  YPSpur_msg msg;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_SET_ANGVEL;
  msg.data[0] = w;

  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  return 1;
}